

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall Fir1::getCoeff(Fir1 *this,double *coeff_data,uint number_of_taps)

{
  out_of_range *this_00;
  uint in_EDX;
  void *in_RSI;
  undefined8 *in_RDI;
  
  if (in_EDX < *(uint *)(in_RDI + 2)) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"Fir1: target of getCoeff: too many weights to copy into target");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  memcpy(in_RSI,(void *)*in_RDI,(ulong)*(uint *)(in_RDI + 2) << 3);
  if (*(uint *)(in_RDI + 2) < in_EDX) {
    memset((void *)((long)in_RSI + (ulong)*(uint *)(in_RDI + 2) * 8),0,
           (ulong)(in_EDX - *(int *)(in_RDI + 2)) << 3);
  }
  return;
}

Assistant:

void Fir1::getCoeff(double* coeff_data, unsigned number_of_taps) const {
	
	if (number_of_taps < taps)
		throw std::out_of_range("Fir1: target of getCoeff: too many weights to copy into target");
 
	memcpy(coeff_data, coefficients, taps * sizeof(double));
	if (number_of_taps > taps)
		memset(&coeff_data[taps], 0, (number_of_taps - taps)*sizeof(double));
}